

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O0

bool __thiscall
DbCheckPostLower::IsCallToHelper(DbCheckPostLower *this,Instr *instr,JnHelperMethod method)

{
  Instr *this_00;
  bool bVar1;
  Opnd *this_01;
  HelperCallOpnd *pHVar2;
  bool local_31;
  Opnd *src1;
  Instr *prev;
  JnHelperMethod method_local;
  Instr *instr_local;
  DbCheckPostLower *this_local;
  
  this_00 = instr->m_prev;
  this_01 = IR::Instr::GetSrc1(this_00);
  local_31 = false;
  if (((instr->m_opcode == CALL) && (local_31 = false, this_00->m_opcode == MOV)) &&
     (local_31 = false, this_01 != (Opnd *)0x0)) {
    bVar1 = IR::Opnd::IsHelperCallOpnd(this_01);
    local_31 = false;
    if (bVar1) {
      pHVar2 = IR::Opnd::AsHelperCallOpnd(this_01);
      local_31 = pHVar2->m_fnHelper == method;
    }
  }
  return local_31;
}

Assistant:

bool
DbCheckPostLower::IsCallToHelper(IR::Instr *instr, IR::JnHelperMethod method)
{
    IR::Instr *prev = instr->m_prev;
    IR::Opnd *src1 = prev->GetSrc1();
    return instr->m_opcode == Js::OpCode::CALL &&
        prev->m_opcode == Js::OpCode::MOV &&
        src1 &&
        src1->IsHelperCallOpnd() &&
        src1->AsHelperCallOpnd()->m_fnHelper == method;
}